

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::SetObjectTypeFromTypeSym
          (GlobOpt *this,StackSym *typeSym,JITTypeHolder type,EquivalentTypeSet *typeSet,
          GlobOptBlockData *blockData,bool updateExistingValue)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ValueInfo *pVVar5;
  EquivalentTypeSet *pEVar6;
  JsTypeValueInfo *valueInfo_00;
  Value *val;
  Value *value_1;
  JsTypeValueInfo *valueInfo_1;
  nullptr_t local_58;
  JITTypeHolderBase<void> local_50;
  JsTypeValueInfo *local_48;
  JsTypeValueInfo *valueInfo;
  Value *value;
  SymID typeSymId;
  bool updateExistingValue_local;
  GlobOptBlockData *blockData_local;
  EquivalentTypeSet *typeSet_local;
  StackSym *typeSym_local;
  GlobOpt *this_local;
  JITTypeHolder type_local;
  
  value._7_1_ = updateExistingValue;
  _typeSymId = blockData;
  blockData_local = (GlobOptBlockData *)typeSet;
  typeSet_local = (EquivalentTypeSet *)typeSym;
  typeSym_local = (StackSym *)this;
  this_local = (GlobOpt *)type.t;
  if (typeSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x759,"(typeSym != nullptr)","typeSym != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  value._0_1_ = typeSet_local[1].sortedAndDuplicatesRemoved;
  value._1_1_ = typeSet_local[1].field_0x1;
  value._2_2_ = typeSet_local[1].count;
  if (_typeSymId == (GlobOptBlockData *)0x0) {
    _typeSymId = &this->currentBlock->globOptData;
  }
  if ((value._7_1_ & 1) == 0) {
    valueInfo_00 = JsTypeValueInfo::New
                             (this->alloc,(JITTypeHolder)this_local,
                              (EquivalentTypeSet *)blockData_local);
    SetSymStoreDirect(this,&valueInfo_00->super_ValueInfo,(Sym *)typeSet_local);
    val = NewValue(this,&valueInfo_00->super_ValueInfo);
    GlobOptBlockData::SetValue(_typeSymId,val,(Sym *)typeSet_local);
    goto LAB_00604c1a;
  }
  valueInfo = (JsTypeValueInfo *)GlobOptBlockData::FindValueFromMapDirect(_typeSymId,(SymID)value);
  if ((valueInfo == (JsTypeValueInfo *)0x0) ||
     (pVVar5 = ::Value::GetValueInfo((Value *)valueInfo), pVVar5 == (ValueInfo *)0x0)) {
LAB_00604a5e:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x768,
                       "(value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())"
                       ,
                       "value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  else {
    pVVar5 = ::Value::GetValueInfo((Value *)valueInfo);
    bVar2 = ValueInfo::IsJsType(pVVar5);
    if (!bVar2) goto LAB_00604a5e;
  }
  pVVar5 = ::Value::GetValueInfo((Value *)valueInfo);
  local_48 = ValueInfo::AsJsType(pVVar5);
  local_50.t = (Type)JsTypeValueInfo::GetJsType(local_48);
  local_58 = (nullptr_t)0x0;
  bVar3 = JITTypeHolderBase<void>::operator==(&local_50,&local_58);
  bVar2 = false;
  if (bVar3) {
    pEVar6 = JsTypeValueInfo::GetJsTypeSet(local_48);
    bVar2 = pEVar6 == (EquivalentTypeSet *)0x0;
  }
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x76a,
                       "(valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr)"
                       ,"valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  UpdateObjectTypeValue
            (this,(Value *)valueInfo,(JITTypeHolder)this_local,true,
             (EquivalentTypeSet *)blockData_local,true);
LAB_00604c1a:
  BVSparse<Memory::JitArenaAllocator>::Set(_typeSymId->liveFields,(SymID)value);
  return;
}

Assistant:

void
GlobOpt::SetObjectTypeFromTypeSym(StackSym *typeSym, const JITTypeHolder type, Js::EquivalentTypeSet * typeSet, GlobOptBlockData *blockData, bool updateExistingValue)
{
    Assert(typeSym != nullptr);

    SymID typeSymId = typeSym->m_id;

    if (blockData == nullptr)
    {
        blockData = &this->currentBlock->globOptData;
    }

    if (updateExistingValue)
    {
        Value* value = blockData->FindValueFromMapDirect(typeSymId);

        // If we're trying to update an existing value, the value better exist. We only do this when updating a generic
        // value created during loop pre-pass for field hoisting, so we expect the value info to still be blank.
        Assert(value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());
        JsTypeValueInfo* valueInfo = value->GetValueInfo()->AsJsType();
        Assert(valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr);
        UpdateObjectTypeValue(value, type, true, typeSet, true);
    }
    else
    {
        JsTypeValueInfo* valueInfo = JsTypeValueInfo::New(this->alloc, type, typeSet);
        this->SetSymStoreDirect(valueInfo, typeSym);
        Value* value = NewValue(valueInfo);
        blockData->SetValue(value, typeSym);
    }

    blockData->liveFields->Set(typeSymId);
}